

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void __thiscall Instrument::Instrument(Instrument *this,ISMSnoop *ismsnoop,string *path)

{
  ISMSnoopInstrument *pIVar1;
  undefined8 uVar2;
  undefined1 local_2f0 [8];
  ResultBuilder __catchResult;
  undefined1 local_40 [16];
  undefined8 local_30;
  
  this->ismsnoop_ = ismsnoop;
  local_2f0 = (undefined1  [8])(path->_M_dataplus)._M_p;
  if ((ismsnoop->open).super__Function_base._M_manager == (_Manager_type)0x0) {
    uVar2 = std::__throw_bad_function_call();
    __cxa_begin_catch(uVar2);
    Catch::ResultBuilder::useActiveException((ResultBuilder *)local_2f0,Normal);
    __cxa_end_catch();
  }
  else {
    pIVar1 = (*(ismsnoop->open)._M_invoker)((_Any_data *)ismsnoop,(char **)local_2f0);
    this->instrument_ = pIVar1;
    __catchResult._664_8_ = local_40;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&__catchResult.m_shouldDebugBreak,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Penhorse[P]ismsnoop/test/src/main.cpp"
               ,"");
    local_30 = 0x47;
    Catch::ResultBuilder::ResultBuilder
              ((ResultBuilder *)local_2f0,"REQUIRE",
               (SourceLineInfo *)&__catchResult.m_shouldDebugBreak,"instrument_",Normal);
    if ((undefined1 *)__catchResult._664_8_ != local_40) {
      operator_delete((void *)__catchResult._664_8_);
    }
    __catchResult._664_8_ = (ResultBuilder *)local_2f0;
    Catch::ExpressionLhs<ISMSnoopInstrument_*const_&>::endExpression
              ((ExpressionLhs<ISMSnoopInstrument_*const_&> *)&__catchResult.m_shouldDebugBreak);
  }
  Catch::ResultBuilder::react((ResultBuilder *)local_2f0);
  Catch::ResultBuilder::~ResultBuilder((ResultBuilder *)local_2f0);
  return;
}

Assistant:

Instrument::Instrument(const ISMSnoop & ismsnoop, const std::string & path)
	: ismsnoop_(&ismsnoop)
	, instrument_(ismsnoop_->open(path.c_str()))
{
	REQUIRE(instrument_);
}